

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
EqualsFailure::EqualsFailure
          (EqualsFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  undefined1 local_68 [48];
  SimpleString *local_38;
  SimpleString *actual_local;
  SimpleString *expected_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  EqualsFailure *this_local;
  
  local_38 = actual;
  actual_local = expected;
  expected_local = (SimpleString *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__EqualsFailure_00368758;
  TestFailure::createUserText((TestFailure *)(local_68 + 0x20),(SimpleString *)this);
  SimpleString::operator=(&(this->super_TestFailure).message_,(SimpleString *)(local_68 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_68 + 0x20));
  TestFailure::createButWasString((TestFailure *)local_68,(SimpleString *)this,actual_local);
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_68);
  SimpleString::~SimpleString((SimpleString *)local_68);
  return;
}

Assistant:

EqualsFailure::EqualsFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
    : TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(expected, actual);
}